

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

void __thiscall
google::protobuf::TextFormat::Printer::HardenedPrintString
          (Printer *this,string_view src,BaseTextGenerator *generator)

{
  Printer *pPVar1;
  byte bVar2;
  long lVar3;
  int *piVar4;
  Printer *pPVar5;
  ulong uVar6;
  Printer *pPVar7;
  long *plVar8;
  Printer *pPVar9;
  Printer *unaff_R12;
  Printer *pPVar10;
  Printer *pPVar11;
  ulong uVar12;
  size_t sVar13;
  bool bVar14;
  long *local_50;
  undefined8 local_48;
  long local_40 [2];
  
  plVar8 = (long *)src._M_str;
  sVar13 = src._M_len;
  (**(code **)(*plVar8 + 0x28))(plVar8,"\"",1);
  do {
    if (this == (Printer *)0x0) break;
    pPVar10 = (Printer *)0x0;
    pPVar9 = unaff_R12;
    do {
      bVar2 = *(byte *)((long)&pPVar10->initial_indent_level_ + sVar13);
      if ((char)bVar2 < '\0') {
        pPVar5 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1);
        pPVar7 = pPVar10;
        if (pPVar5 < this) {
          pPVar5 = this;
        }
        do {
          pPVar1 = (Printer *)((long)&pPVar7->initial_indent_level_ + 1);
          pPVar11 = pPVar5;
          if (this <= pPVar1) break;
          piVar4 = &pPVar7->initial_indent_level_;
          pPVar7 = pPVar1;
          pPVar11 = pPVar1;
        } while (*(char *)((long)piVar4 + sVar13 + 1) < '\0');
        if (this < pPVar10) {
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     pPVar10,this);
        }
        uVar12 = (long)pPVar11 - (long)pPVar10;
        uVar6 = (long)this - (long)pPVar10;
        if (uVar12 <= (ulong)((long)this - (long)pPVar10)) {
          uVar6 = uVar12;
        }
        uVar6 = utf8_range::SpanStructurallyValid
                          (uVar6,(long)&pPVar10->initial_indent_level_ + sVar13);
        bVar14 = uVar6 == uVar12;
        lVar3 = uVar6 - 1;
        if (!bVar14) {
          pPVar9 = (Printer *)((long)&pPVar10->initial_indent_level_ + uVar6);
          lVar3 = 0;
        }
        pPVar10 = (Printer *)((long)&pPVar10->initial_indent_level_ + lVar3);
      }
      else if (((byte)(bVar2 - 0x20) < 0x5f) &&
              ((0x3a < bVar2 - 0x22 ||
               ((0x400000000000021U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)))) {
        bVar14 = true;
      }
      else {
        bVar14 = false;
        pPVar9 = pPVar10;
      }
      unaff_R12 = pPVar9;
    } while ((bVar14) &&
            (pPVar10 = (Printer *)((long)&pPVar10->initial_indent_level_ + 1), unaff_R12 = this,
            pPVar10 < this));
    if (unaff_R12 == (Printer *)0x0) {
LAB_00300916:
      absl::lts_20240722::CEscape_abi_cxx11_(&local_50,1,sVar13);
      (**(code **)(*plVar8 + 0x28))(plVar8,local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      sVar13 = sVar13 + 1;
      this = (Printer *)((long)&this[-1].finder_ + 7);
      bVar14 = true;
    }
    else {
      pPVar9 = unaff_R12;
      if (this < unaff_R12) {
        pPVar9 = this;
      }
      (**(code **)(*plVar8 + 0x28))(plVar8,sVar13,pPVar9);
      sVar13 = (long)&unaff_R12->initial_indent_level_ + sVar13;
      this = (Printer *)((long)this - (long)unaff_R12);
      if (this != (Printer *)0x0) goto LAB_00300916;
      bVar14 = false;
    }
  } while (bVar14);
  (**(code **)(*plVar8 + 0x28))(plVar8,"\"",1);
  return;
}

Assistant:

void TextFormat::Printer::HardenedPrintString(
    absl::string_view src, TextFormat::BaseTextGenerator* generator) {
  // Print as UTF-8, while guarding against any invalid UTF-8 in the string
  // field.
  //
  // If in the future we have a guaranteed invariant that invalid UTF-8 will
  // never be present, we could avoid the UTF-8 check here.

  generator->PrintLiteral("\"");
  while (!src.empty()) {
    size_t n = SkipPassthroughBytes(src);
    if (n != 0) {
      generator->PrintString(src.substr(0, n));
      src.remove_prefix(n);
      if (src.empty()) break;
    }

    // If repeated calls to CEscape() and PrintString() are expensive, we could
    // consider batching them, at the cost of some complexity.
    generator->PrintString(absl::CEscape(src.substr(0, 1)));
    src.remove_prefix(1);
  }
  generator->PrintLiteral("\"");
}